

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall
JsonParser_serialize_fu16_string_Test::TestBody(JsonParser_serialize_fu16_string_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_e8 [8];
  Message local_e0 [8];
  undefined1 local_d8 [8];
  AssertionResult gtest_ar;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_b8;
  object local_a8;
  undefined1 local_68 [8];
  string serialized_bytes;
  undefined1 local_38 [8];
  string fu16text;
  json_parser parser;
  JsonParser_serialize_fu16_string_Test *this_local;
  
  jessilib::json_parser::json_parser((json_parser *)(fu16text.field_2._M_local_buf + 8));
  join_0x00000010_0x00000000_ = (undefined1  [16])sv(L"\"\\\"text\\\"\"",10);
  make_foreign_string<char16_t>
            ((string *)local_38,
             (basic_string_view<char16_t,_std::char_traits<char16_t>_>)join_0x00000010_0x00000000_);
  local_b8 = sv("\"text\"",6);
  jessilib::object::object(&local_a8,(basic_string_view *)&local_b8);
  jessilib::json_parser::serialize_bytes_abi_cxx11_((object *)local_68,(int)&fu16text + 0x18);
  jessilib::object::~object(&local_a8);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_d8,"serialized_bytes","fu16text",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d8);
  if (!bVar1) {
    testing::Message::Message(local_e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d8);
    testing::internal::AssertHelper::AssertHelper
              (local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0x138,pcVar2);
    testing::internal::AssertHelper::operator=(local_e8,local_e0);
    testing::internal::AssertHelper::~AssertHelper(local_e8);
    testing::Message::~Message(local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d8);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TEST(JsonParser, serialize_fu16_string) {
	json_parser parser;
	std::string fu16text = make_foreign_string(uR"json("\"text\"")json"sv);

	// Deserialize foreign utf-16 text
	std::string serialized_bytes = parser.serialize_bytes(u8R"json("text")json"sv, text_encoding::utf_16_foreign);
	EXPECT_EQ(serialized_bytes, fu16text);
}